

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_GTK.cxx
# Opt level: O3

char * __thiscall Fl_GTK_File_Chooser::filename(Fl_GTK_File_Chooser *this)

{
  gboolean gVar1;
  char *pcVar2;
  char **ppcVar3;
  
  if ((GtkFileChooser *)this->gtkw_ptr == (GtkFileChooser *)0x0) {
    pcVar2 = "";
  }
  else {
    gVar1 = (*fl_gtk_file_chooser_get_select_multiple)((GtkFileChooser *)this->gtkw_ptr);
    if (gVar1 == 0) {
      ppcVar3 = &this->gtkw_filename;
    }
    else {
      ppcVar3 = (char **)this->gtkw_slist;
    }
    pcVar2 = *ppcVar3;
  }
  return pcVar2;
}

Assistant:

const char *Fl_GTK_File_Chooser::filename() const
{
  if(gtkw_ptr) {
    if(fl_gtk_file_chooser_get_select_multiple((GtkFileChooser *)gtkw_ptr) == FALSE) {
      return gtkw_filename;
    }
    else {
      GSList *iter = (GSList *)gtkw_slist;
      char *nm = (char *)iter->data;
      return nm;
    }
  }
  return("");
}